

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_lights.cxx
# Opt level: O2

void __thiscall xray_re::xr_scene_lights::save(xr_scene_lights *this,xr_writer *w)

{
  undefined1 local_1f;
  unsigned_short local_1e;
  undefined4 local_1c;
  
  xr_scene_objects::save(&this->super_xr_scene_objects,w);
  local_1e = 0;
  xr_writer::w_chunk<unsigned_short>(w,0x1001,&local_1e);
  xr_writer::w_chunk<unsigned_int>(w,0x1004,&this->m_flags);
  xr_writer::open_chunk(w,0x1006);
  local_1f = 0;
  (*w->_vptr_xr_writer[2])(w,&local_1f,1);
  xr_writer::w_fvector2(w,&this->m_sun);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0x1003);
  local_1c = (undefined4)
             (((long)(this->m_controls).
                     super__Vector_base<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)(this->m_controls).
                    super__Vector_base<xray_re::xr_token,_std::allocator<xray_re::xr_token>_>.
                    _M_impl.super__Vector_impl_data._M_start) / 0x28);
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,0x1002);
  xr_writer::w_seq<std::vector<xray_re::xr_token,std::allocator<xray_re::xr_token>>,write_token>
            (w,&this->m_controls);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void xr_scene_lights::save(xr_writer& w) const
{
	xr_scene_objects::save(w);
	w.w_chunk<uint16_t>(TOOLS_CHUNK_VERSION, 0);
	w.w_chunk<uint32_t>(LIGHTS_CHUNK_COMMON_FLAGS, m_flags);

	w.open_chunk(LIGHTS_CHUNK_COMMON_SUN);
	w.w_u8(0);
	w.w_fvector2(m_sun);
	w.close_chunk();

	w.open_chunk(LIGHTS_CHUNK_COMMON_COUNT);
	w.w_size_u32(m_controls.size());
	w.close_chunk();

	w.open_chunk(LIGHTS_CHUNK_COMMON_CONTROLS);
	w.w_seq(m_controls, write_token());
	w.close_chunk();
}